

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

RelocInsert * initRelocInsert(RelocInsert *ri,uint16_t pos,uint16_t siz,lword msk)

{
  lword in_RCX;
  uint16_t in_DX;
  uint16_t in_SI;
  RelocInsert *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  RelocInsert *local_8;
  
  local_8 = in_RDI;
  if (in_RDI == (RelocInsert *)0x0) {
    local_8 = (RelocInsert *)alloc(CONCAT26(in_SI,CONCAT24(in_DX,in_stack_fffffffffffffff0)));
  }
  local_8->next = (RelocInsert *)0x0;
  local_8->bpos = in_SI;
  local_8->bsiz = in_DX;
  local_8->mask = in_RCX;
  return local_8;
}

Assistant:

struct RelocInsert *initRelocInsert(struct RelocInsert *ri,uint16_t pos,
                                    uint16_t siz,lword msk)
{
  if (ri == NULL)
    ri = alloc(sizeof(struct RelocInsert));
  ri->next = NULL;
  ri->bpos = pos;
  ri->bsiz = siz;
  ri->mask = msk;
  return ri;
}